

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

bool __thiscall
QDockWidgetPrivate::mouseDoubleClickEvent(QDockWidgetPrivate *this,QMouseEvent *event)

{
  bool bVar1;
  MouseButton MVar2;
  uint uVar3;
  QDockWidgetLayout *this_00;
  QSinglePointEvent *in_RSI;
  QDockWidgetLayout *in_RDI;
  long in_FS_OFFSET;
  QDockWidgetLayout *dwLayout;
  QRect titleArea;
  DockWidgetFeature in_stack_ffffffffffffff9c;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  bool local_31;
  QPoint local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = qobject_cast<QDockWidgetLayout*>((QObject *)0x58da36);
  bVar1 = QDockWidgetLayout::nativeWindowDeco(this_00);
  if (!bVar1) {
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = (undefined1  [16])QDockWidgetLayout::titleArea(in_RDI);
    MVar2 = QSinglePointEvent::button(in_RSI);
    bVar1 = false;
    if (MVar2 == LeftButton) {
      QSinglePointEvent::position((QSinglePointEvent *)0x58da9a);
      local_20 = QPointF::toPoint((QPointF *)this_00);
      uVar3 = QRect::contains((QPoint *)local_18,SUB81(&local_20,0));
      bVar1 = false;
      if ((uVar3 & 1) != 0) {
        bVar1 = hasFeature((QDockWidgetPrivate *)
                           (ulong)CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff9c);
      }
    }
    if (bVar1 != false) {
      toggleTopLevel((QDockWidgetPrivate *)
                     CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
      local_31 = true;
      goto LAB_0058db0a;
    }
  }
  local_31 = false;
LAB_0058db0a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_31;
}

Assistant:

bool QDockWidgetPrivate::mouseDoubleClickEvent(QMouseEvent *event)
{
    QDockWidgetLayout *dwLayout = qobject_cast<QDockWidgetLayout*>(layout);

    if (!dwLayout->nativeWindowDeco()) {
        QRect titleArea = dwLayout->titleArea();

        if (event->button() == Qt::LeftButton && titleArea.contains(event->position().toPoint()) &&
            hasFeature(this, QDockWidget::DockWidgetFloatable)) {
            toggleTopLevel();
            return true;
        }
    }
    return false;
}